

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O2

void __thiscall DBaseStatusBar::Destroy(DBaseStatusBar *this)

{
  DHUDMessage *pDVar1;
  DHUDMessage *pDVar2;
  size_t i;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    pDVar1 = GC::ReadBarrier<DHUDMessage>(&this->Messages[lVar3].field_0.p);
    while (pDVar1 != (DHUDMessage *)0x0) {
      pDVar2 = GC::ReadBarrier<DHUDMessage>((DHUDMessage **)&pDVar1->Next);
      (*(pDVar1->super_DObject)._vptr_DObject[4])(pDVar1);
      pDVar1 = pDVar2;
    }
    this->Messages[lVar3].field_0.p = (DHUDMessage *)0x0;
  }
  DObject::Destroy(&this->super_DObject);
  return;
}

Assistant:

void DBaseStatusBar::Destroy ()
{
	for (size_t i = 0; i < countof(Messages); ++i)
	{
		DHUDMessage *msg = Messages[i];
		while (msg)
		{
			DHUDMessage *next = msg->Next;
			msg->Destroy();
			msg = next;
		}
		Messages[i] = NULL;
	}
	Super::Destroy();
}